

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSharedData::SetCircleTessellationMaxError(ImDrawListSharedData *this,float max_error)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float radius;
  int i;
  undefined1 local_24;
  undefined4 local_10;
  
  if ((*(float *)(in_RDI + 0x18) != in_XMM0_Da) ||
     (NAN(*(float *)(in_RDI + 0x18)) || NAN(in_XMM0_Da))) {
    *(float *)(in_RDI + 0x18) = in_XMM0_Da;
    for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
      if (local_10 < 1) {
        local_24 = 0x30;
      }
      else {
        fVar2 = ImMin<float>(*(float *)(in_RDI + 0x18),(float)local_10);
        fVar2 = acosf(1.0 - fVar2 / (float)local_10);
        fVar2 = ceilf(3.1415927 / fVar2);
        iVar1 = ImClamp<int>(((int)fVar2 + 1) / 2 << 1,4,0x200);
        local_24 = (undefined1)iVar1;
      }
      *(undefined1 *)(in_RDI + 0x1c4 + (long)local_10) = local_24;
    }
    fVar2 = *(float *)(in_RDI + 0x18);
    fVar3 = ImMax<float>(48.0,3.1415927);
    fVar3 = cosf(3.1415927 / fVar3);
    *(float *)(in_RDI + 0x1c0) = fVar2 / (1.0 - fVar3);
  }
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleTessellationMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;

    IM_ASSERT(max_error > 0.0f);
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = (float)i;
        CircleSegmentCounts[i] = (ImU8)((i > 0) ? IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError) : IM_DRAWLIST_ARCFAST_SAMPLE_MAX);
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}